

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O1

void generate<short>(style gen_style)

{
  function<void_(short)> local_48;
  function<void_(short)> local_28;
  
  if (gen_style != const_func) {
    if (gen_style == cpp_template) {
      local_48.super__Function_base._M_functor._8_8_ = 0;
      local_48.super__Function_base._M_functor._M_unused._M_object =
           generate_specialized_template<short>;
      local_48._M_invoker = std::_Function_handler<void_(short),_void_(*)(short)>::_M_invoke;
      local_48.super__Function_base._M_manager =
           std::_Function_handler<void_(short),_void_(*)(short)>::_M_manager;
      generator<short>(&local_48);
      if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_48.super__Function_base._M_manager)
                  ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
      }
    }
    else if (gen_style == macro) {
      local_28.super__Function_base._M_functor._8_8_ = 0;
      local_28.super__Function_base._M_functor._M_unused._M_object = generate_constant_macro<short>;
      local_28._M_invoker = std::_Function_handler<void_(short),_void_(*)(short)>::_M_invoke;
      local_28.super__Function_base._M_manager =
           std::_Function_handler<void_(short),_void_(*)(short)>::_M_manager;
      generator<short>(&local_28);
      if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_28.super__Function_base._M_manager)
                  ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
      }
    }
    return;
  }
  generate_const_func<short>();
  return;
}

Assistant:

void generate(style gen_style) {
    switch (gen_style)
    {
    case style::macro:
        generator<_IntT>(&generate_constant_macro<_IntT>);
        break;
    case style::cpp_template:
        generator<_IntT>(&generate_specialized_template<_IntT>);
        break;
    
    case style::const_func:
        generate_const_func<_IntT>();
        break;

    default:
        break;
    }
}